

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFuelReload.cpp
# Opt level: O1

bool __thiscall DIS::EngineFuelReload::operator==(EngineFuelReload *this,EngineFuelReload *rhs)

{
  return (((this->_maximumQuantityReloadTime == rhs->_maximumQuantityReloadTime &&
           this->_standardQuantityReloadTime == rhs->_standardQuantityReloadTime) &&
          this->_maximumQuantity == rhs->_maximumQuantity) &&
         ((this->_padding == rhs->_padding && rhs->_fuelLocation == this->_fuelLocation) &&
         rhs->_fuelMeasurmentUnits == this->_fuelMeasurmentUnits)) &&
         this->_standardQuantity == rhs->_standardQuantity;
}

Assistant:

bool EngineFuelReload::operator ==(const EngineFuelReload& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_standardQuantity == rhs._standardQuantity) ) ivarsEqual = false;
     if( ! (_maximumQuantity == rhs._maximumQuantity) ) ivarsEqual = false;
     if( ! (_standardQuantityReloadTime == rhs._standardQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_maximumQuantityReloadTime == rhs._maximumQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_fuelMeasurmentUnits == rhs._fuelMeasurmentUnits) ) ivarsEqual = false;
     if( ! (_fuelLocation == rhs._fuelLocation) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }